

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void skip_comment(FT_Byte **acur,FT_Byte *limit)

{
  FT_Byte *local_20;
  FT_Byte *cur;
  FT_Byte *limit_local;
  FT_Byte **acur_local;
  
  for (local_20 = *acur; ((local_20 < limit && (*local_20 != '\r')) && (*local_20 != '\n'));
      local_20 = local_20 + 1) {
  }
  *acur = local_20;
  return;
}

Assistant:

static void
  skip_comment( FT_Byte*  *acur,
                FT_Byte*   limit )
  {
    FT_Byte*  cur = *acur;


    while ( cur < limit )
    {
      if ( IS_PS_NEWLINE( *cur ) )
        break;
      cur++;
    }

    *acur = cur;
  }